

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::insert_move_before(xml_node *this,xml_node *moved,xml_node *node)

{
  ulong *puVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  bool bVar6;
  xml_node_struct **ppxVar7;
  xml_node_struct *pxVar8;
  xml_node local_20;
  
  bVar6 = impl::anon_unknown_0::allow_move((xml_node)this->_root,(xml_node)moved->_root);
  if ((bVar6) && (pxVar2 = node->_root, pxVar2 != (xml_node_struct *)0x0)) {
    pxVar3 = this->_root;
    if ((pxVar2->parent == pxVar3) && (pxVar4 = moved->_root, pxVar4 != pxVar2)) {
      if (pxVar2->parent != (xml_node_struct *)0x0) {
        puVar1 = (ulong *)(*(long *)((long)pxVar3 - (pxVar3->header >> 8)) + -0x40);
        *puVar1 = *puVar1 | 0x40;
        pxVar2 = pxVar4->parent;
        pxVar3 = pxVar4->prev_sibling_c;
        pxVar5 = pxVar4->next_sibling;
        pxVar8 = pxVar5;
        if (pxVar5 == (xml_node_struct *)0x0) {
          pxVar8 = pxVar2->first_child;
        }
        pxVar8->prev_sibling_c = pxVar3;
        ppxVar7 = &pxVar2->first_child;
        if (pxVar3->next_sibling != (xml_node_struct *)0x0) {
          ppxVar7 = &pxVar3->next_sibling;
        }
        *ppxVar7 = pxVar5;
        pxVar4->parent = (xml_node_struct *)0x0;
        pxVar4->prev_sibling_c = (xml_node_struct *)0x0;
        pxVar4->next_sibling = (xml_node_struct *)0x0;
        pxVar2 = moved->_root;
        pxVar3 = node->_root;
        pxVar4 = pxVar3->parent;
        pxVar2->parent = pxVar4;
        pxVar5 = pxVar3->prev_sibling_c;
        ppxVar7 = &pxVar4->first_child;
        if (pxVar5->next_sibling != (xml_node_struct *)0x0) {
          ppxVar7 = &pxVar5->next_sibling;
        }
        *ppxVar7 = pxVar2;
        pxVar2->prev_sibling_c = pxVar5;
        pxVar2->next_sibling = pxVar3;
        pxVar3->prev_sibling_c = pxVar2;
        return (xml_node)moved->_root;
      }
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
  }
  xml_node(&local_20);
  return (xml_node)local_20._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_before(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_before(moved._root, node._root);

		return moved;
	}